

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O3

string * __thiscall
TargetPropertyNode::Evaluate
          (string *__return_storage_ptr__,TargetPropertyNode *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,cmGeneratorExpressionContext *context,GeneratorExpressionContent *content,
          cmGeneratorExpressionDAGChecker *dagCheckerParent)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  Result RVar4;
  PolicyStatus PVar5;
  TargetType TVar6;
  long lVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  cmGeneratorTarget *pcVar11;
  string *psVar12;
  cmLinkInterfaceLibraries *libraries;
  cmLinkImplementationLibraries *libraries_00;
  char *pcVar13;
  cmGeneratorExpressionDAGChecker *this_00;
  cmGeneratorTarget *target;
  string propertyName;
  string prop;
  string linkedTargetsContent;
  string targetName;
  string interfacePropertyName;
  cmGeneratorExpressionDAGChecker dagChecker;
  cmGeneratorTarget *local_2b0;
  string local_2a8;
  string local_288;
  cmGeneratorExpressionDAGChecker *local_268;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  char *local_1e0;
  cmListFileBacktrace local_1d8;
  string local_1c8;
  undefined1 local_1a8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_178;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  
  local_268 = dagCheckerParent;
  if ((Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
       ::propertyNameValidator == '\0') &&
     (iVar3 = __cxa_guard_acquire(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                                   ::propertyNameValidator), iVar3 != 0)) {
    Evaluate::propertyNameValidator.regmatch.startp[0] = (char *)0x0;
    Evaluate::propertyNameValidator.regmatch.endp[0] = (char *)0x0;
    Evaluate::propertyNameValidator.regmatch.searchstring = (char *)0x0;
    Evaluate::propertyNameValidator.program = (char *)0x0;
    cmsys::RegularExpression::compile(&Evaluate::propertyNameValidator,"^[A-Za-z0-9_]+$");
    __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&Evaluate::propertyNameValidator,
                 &__dso_handle);
    __cxa_guard_release(&Evaluate(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmGeneratorExpressionContext*,GeneratorExpressionContent_const*,cmGeneratorExpressionDAGChecker*)
                         ::propertyNameValidator);
  }
  local_2b0 = (cmGeneratorTarget *)0x0;
  local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
  local_240._M_string_length = 0;
  local_240.field_2._M_local_buf[0] = '\0';
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  local_2a8._M_string_length = 0;
  local_2a8.field_2._M_local_buf[0] = '\0';
  lVar7 = (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(parameters->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar7 == 1) {
    local_2b0 = context->HeadTarget;
    std::__cxx11::string::_M_assign((string *)&local_2a8);
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_insert_unique<std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&context->SeenTargetProperties,&local_2a8);
    context->HadHeadSensitiveCondition = true;
    if (local_2b0 == (cmGeneratorTarget *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,
                 "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  It may not be used with add_custom_command or add_custom_target.  Specify the target to read a property from using the $<TARGET_PROPERTY:tgt,prop> signature instead."
                 ,"");
      reportError(context,(string *)local_1a8,&local_288);
    }
    else {
LAB_00386f9e:
      iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
      if (iVar3 == 0) {
        std::
        _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
        ::_M_insert_unique<cmGeneratorTarget_const*const&>
                  ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                    *)&context->SourceSensitiveTargets,&local_2b0);
      }
      if (local_2a8._M_string_length == 0) {
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
        local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_288,
                   "$<TARGET_PROPERTY:...> expression requires a non-empty property name.","");
        reportError(context,(string *)local_1a8,&local_288);
      }
      else {
        bVar2 = cmsys::RegularExpression::find
                          (&Evaluate::propertyNameValidator,local_2a8._M_dataplus._M_p,
                           &Evaluate::propertyNameValidator.regmatch);
        if (bVar2) {
          if (local_2b0 == (cmGeneratorTarget *)0x0) {
            __assert_fail("target",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionNode.cxx"
                          ,0x4a9,
                          "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                         );
          }
          iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
          pcVar11 = local_2b0;
          if (iVar3 != 0) {
            local_1d8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 = (context->Backtrace).TopEntry.
                   super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
            local_1d8.TopEntry.
            super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi =
                 (context->Backtrace).TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
            if (local_1d8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                (local_1d8.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1d8.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
                UNLOCK();
              }
              else {
                (local_1d8.TopEntry.
                 super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi)->_M_use_count =
                     (local_1d8.TopEntry.
                      super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi)->_M_use_count + 1;
              }
            }
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c8,local_2a8._M_dataplus._M_p,
                       local_2a8._M_dataplus._M_p + local_2a8._M_string_length);
            cmGeneratorExpressionDAGChecker::cmGeneratorExpressionDAGChecker
                      ((cmGeneratorExpressionDAGChecker *)local_1a8,&local_1d8,pcVar11,&local_1c8,
                       content,local_268);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
              operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1
                             );
            }
            if (local_1d8.TopEntry.
                super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1d8.TopEntry.
                         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            RVar4 = cmGeneratorExpressionDAGChecker::Check
                              ((cmGeneratorExpressionDAGChecker *)local_1a8);
            if (RVar4 == SELF_REFERENCE) {
              GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_288,content);
              cmGeneratorExpressionDAGChecker::ReportError
                        ((cmGeneratorExpressionDAGChecker *)local_1a8,context,&local_288);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                         local_288.field_2._M_local_buf[0]) + 1);
              }
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            }
            else if (RVar4 == CYCLIC_REFERENCE) {
              (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2
              ;
              __return_storage_ptr__->_M_string_length = 0;
              (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
            }
            else {
              if (RVar4 == ALREADY_SEEN) {
                lVar7 = 1;
                do {
                  iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                  if (iVar3 == 0) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    __return_storage_ptr__->_M_string_length = 0;
                    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                    goto LAB_00388056;
                  }
                  lVar7 = lVar7 + 1;
                } while (lVar7 != 0xb);
              }
              local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
              local_288._M_string_length = 0;
              local_288.field_2._M_local_buf[0] = '\0';
              local_1e0 = cmGeneratorTarget::GetProperty(local_2b0,&local_2a8);
              if (local_1e0 != (char *)0x0) {
                std::__cxx11::string::operator=((string *)&local_288,local_1e0);
              }
              this_00 = local_268;
              if (((local_268 == (cmGeneratorExpressionDAGChecker *)0x0) ||
                  (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingGenexExpression(local_268),
                  bVar2)) ||
                 (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingPICExpression(this_00), bVar2))
              {
LAB_003874a9:
                local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                local_260._M_string_length = 0;
                local_260.field_2._M_local_buf[0] = '\0';
                local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                local_220._M_string_length = 0;
                local_220.field_2._M_local_buf[0] = '\0';
                iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                if (iVar3 == 0) {
                  pcVar8 = "INTERFACE_INCLUDE_DIRECTORIES";
LAB_00387c61:
                  std::__cxx11::string::operator=((string *)&local_220,pcVar8);
LAB_00387c6e:
                  pcVar11 = local_2b0;
                  if ((local_220._M_string_length != 0) &&
                     (libraries_00 = cmGeneratorTarget::GetLinkImplementationLibraries
                                               (local_2b0,&context->Config),
                     libraries_00 != (cmLinkImplementationLibraries *)0x0)) {
                    getLinkedTargetsContent<cmLinkImplItem>
                              (&local_200,&libraries_00->Libraries,local_2b0,local_2b0,context,
                               (cmGeneratorExpressionDAGChecker *)local_1a8,&local_220);
LAB_00387cc1:
                    std::__cxx11::string::operator=((string *)&local_260,(string *)&local_200);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_200._M_dataplus._M_p != &local_200.field_2) {
                      operator_delete(local_200._M_dataplus._M_p,
                                      local_200.field_2._M_allocated_capacity + 1);
                    }
                  }
                }
                else {
                  pcVar8 = "INTERFACE_INCLUDE_DIRECTORIES";
                  iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                  if (iVar3 != 0) {
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_SYSTEM_INCLUDE_DIRECTORIES";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_COMPILE_DEFINITIONS";
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_COMPILE_DEFINITIONS";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_COMPILE_OPTIONS";
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_COMPILE_OPTIONS";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_AUTOUIC_OPTIONS";
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_AUTOUIC_OPTIONS";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_SOURCES";
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_SOURCES";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_COMPILE_FEATURES";
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_COMPILE_FEATURES";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_LINK_OPTIONS";
                      this_00 = local_268;
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_LINK_OPTIONS";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    this_00 = local_268;
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_LINK_DIRECTORIES";
                      this_00 = local_268;
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_LINK_DIRECTORIES";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    this_00 = local_268;
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    if (iVar3 == 0) {
                      pcVar8 = "INTERFACE_LINK_DEPENDS";
                      this_00 = local_268;
                      goto LAB_00387c61;
                    }
                    pcVar8 = "INTERFACE_LINK_DEPENDS";
                    iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                    this_00 = local_268;
                    if (iVar3 == 0) goto LAB_003877d3;
                    iVar3 = strncmp(local_2a8._M_dataplus._M_p,"COMPILE_DEFINITIONS_",0x14);
                    if ((iVar3 == 0) &&
                       (PVar5 = cmLocalGenerator::GetPolicyStatus(context->LG,CMP0043), PVar5 < NEW)
                       ) {
                      std::__cxx11::string::operator=
                                ((string *)&local_220,"INTERFACE_COMPILE_DEFINITIONS");
                    }
                    goto LAB_00387c6e;
                  }
LAB_003877d3:
                  std::__cxx11::string::operator=((string *)&local_220,pcVar8);
                  pcVar11 = context->HeadTarget;
                  if (context->HeadTarget == (cmGeneratorTarget *)0x0) {
                    pcVar11 = local_2b0;
                  }
                  libraries = cmGeneratorTarget::GetLinkInterfaceLibraries
                                        (local_2b0,&context->Config,pcVar11,true);
                  if (libraries != (cmLinkInterfaceLibraries *)0x0) {
                    getLinkedTargetsContent<cmLinkItem>
                              (&local_200,&libraries->Libraries,local_2b0,pcVar11,context,
                               (cmGeneratorExpressionDAGChecker *)local_1a8,&local_220);
                    goto LAB_00387cc1;
                  }
                }
                if (local_1e0 == (char *)0x0) {
                  bVar2 = cmGeneratorTarget::IsImported(local_2b0);
                  if ((bVar2) ||
                     (TVar6 = cmGeneratorTarget::GetType(local_2b0), TVar6 == INTERFACE_LIBRARY)) {
                    (__return_storage_ptr__->_M_dataplus)._M_p =
                         (pointer)&__return_storage_ptr__->field_2;
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_260._M_dataplus._M_p == &local_260.field_2) {
                      (__return_storage_ptr__->field_2)._M_allocated_capacity =
                           CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                    local_260.field_2._M_local_buf[0]);
                      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                           local_260.field_2._8_8_;
                    }
                    else {
                      (__return_storage_ptr__->_M_dataplus)._M_p = local_260._M_dataplus._M_p;
                      (__return_storage_ptr__->field_2)._M_allocated_capacity =
                           CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                    local_260.field_2._M_local_buf[0]);
                    }
                    __return_storage_ptr__->_M_string_length = local_260._M_string_length;
                    local_260._M_string_length = 0;
                    local_260.field_2._M_local_buf[0] = '\0';
                    local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                  }
                  else {
                    psVar12 = &context->Config;
                    bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentBoolProperty
                                      (local_2b0,&local_2a8,psVar12);
                    if (bVar2) {
                      context->HadContextSensitiveCondition = true;
                      bVar2 = cmGeneratorTarget::GetLinkInterfaceDependentBoolProperty
                                        (local_2b0,&local_2a8,psVar12);
                      pcVar8 = "0";
                      if (bVar2) {
                        pcVar8 = "1";
                      }
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      pcVar13 = "";
                      if (bVar2) {
                        pcVar13 = "";
                      }
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,pcVar8,pcVar13);
                    }
                    else {
                      bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentStringProperty
                                        (local_2b0,&local_2a8,psVar12);
                      if (bVar2) {
                        context->HadContextSensitiveCondition = true;
                        pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentStringProperty
                                            (local_2b0,&local_2a8,psVar12);
                        pcVar8 = "";
                        if (pcVar13 != (char *)0x0) {
                          pcVar8 = pcVar13;
                        }
                        (__return_storage_ptr__->_M_dataplus)._M_p =
                             (pointer)&__return_storage_ptr__->field_2;
                        sVar9 = strlen(pcVar8);
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)__return_storage_ptr__,pcVar8,pcVar8 + sVar9);
                      }
                      else {
                        bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                          (local_2b0,&local_2a8,psVar12);
                        if (bVar2) {
                          context->HadContextSensitiveCondition = true;
                          pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                              (local_2b0,&local_2a8,psVar12);
                          pcVar8 = "";
                          if (pcVar13 != (char *)0x0) {
                            pcVar8 = pcVar13;
                          }
                          (__return_storage_ptr__->_M_dataplus)._M_p =
                               (pointer)&__return_storage_ptr__->field_2;
                          sVar9 = strlen(pcVar8);
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)__return_storage_ptr__,pcVar8,pcVar8 + sVar9);
                        }
                        else {
                          bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                            (local_2b0,&local_2a8,psVar12);
                          if (bVar2) {
                            context->HadContextSensitiveCondition = true;
                            pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                                (local_2b0,&local_2a8,psVar12);
                            pcVar8 = "";
                            if (pcVar13 != (char *)0x0) {
                              pcVar8 = pcVar13;
                            }
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            sVar9 = strlen(pcVar8);
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)__return_storage_ptr__,pcVar8,pcVar8 + sVar9);
                          }
                          else {
                            (__return_storage_ptr__->_M_dataplus)._M_p =
                                 (pointer)&__return_storage_ptr__->field_2;
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_260._M_dataplus._M_p == &local_260.field_2) {
                              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                                   CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                            local_260.field_2._M_local_buf[0]);
                              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                                   local_260.field_2._8_8_;
                            }
                            else {
                              (__return_storage_ptr__->_M_dataplus)._M_p =
                                   local_260._M_dataplus._M_p;
                              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                                   CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                            local_260.field_2._M_local_buf[0]);
                            }
                            __return_storage_ptr__->_M_string_length = local_260._M_string_length;
                            local_260._M_string_length = 0;
                            local_260.field_2._M_local_buf[0] = '\0';
                            local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
                          }
                        }
                      }
                    }
                  }
                }
                else {
                  bVar2 = cmGeneratorTarget::IsImported(local_2b0);
                  if ((this_00 == (cmGeneratorExpressionDAGChecker *)0x0 || bVar2) ||
                     (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                        (this_00,(cmGeneratorTarget *)0x0), bVar2)) {
LAB_00387d2c:
                    if (local_220._M_string_length == 0) {
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_288._M_dataplus._M_p == &local_288.field_2) {
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                      local_288.field_2._M_local_buf[0]);
                        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) =
                             local_288.field_2._8_8_;
                      }
                      else {
                        (__return_storage_ptr__->_M_dataplus)._M_p = local_288._M_dataplus._M_p;
                        (__return_storage_ptr__->field_2)._M_allocated_capacity =
                             CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                      local_288.field_2._M_local_buf[0]);
                      }
                      __return_storage_ptr__->_M_string_length = local_288._M_string_length;
                      local_288._M_string_length = 0;
                      local_288.field_2._M_local_buf[0] = '\0';
                      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
                    }
                    else {
                      cmGeneratorExpressionNode::EvaluateDependentExpression
                                (__return_storage_ptr__,&local_288,context->LG,context,pcVar11,
                                 local_2b0,(cmGeneratorExpressionDAGChecker *)local_1a8);
                      if (local_260._M_string_length != 0) {
                        pcVar8 = ";";
                        if (__return_storage_ptr__->_M_string_length == 0) {
                          pcVar8 = "";
                        }
                        std::operator+(&local_200,pcVar8,&local_260);
                        std::__cxx11::string::_M_append
                                  ((char *)__return_storage_ptr__,(ulong)local_200._M_dataplus._M_p)
                        ;
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_200._M_dataplus._M_p != &local_200.field_2) {
                          operator_delete(local_200._M_dataplus._M_p,
                                          local_200.field_2._M_allocated_capacity + 1);
                        }
                      }
                    }
                  }
                  else {
                    psVar12 = &context->Config;
                    bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMinProperty
                                      (local_2b0,&local_2a8,psVar12);
                    if (bVar2) {
                      context->HadContextSensitiveCondition = true;
                      pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMinProperty
                                          (local_2b0,&local_2a8,psVar12);
                      pcVar8 = "";
                      if (pcVar13 != (char *)0x0) {
                        pcVar8 = pcVar13;
                      }
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      sVar9 = strlen(pcVar8);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,pcVar8,pcVar8 + sVar9);
                    }
                    else {
                      bVar2 = cmGeneratorTarget::IsLinkInterfaceDependentNumberMaxProperty
                                        (local_2b0,&local_2a8,psVar12);
                      if (!bVar2) goto LAB_00387d2c;
                      context->HadContextSensitiveCondition = true;
                      pcVar13 = cmGeneratorTarget::GetLinkInterfaceDependentNumberMaxProperty
                                          (local_2b0,&local_2a8,psVar12);
                      pcVar8 = "";
                      if (pcVar13 != (char *)0x0) {
                        pcVar8 = pcVar13;
                      }
                      (__return_storage_ptr__->_M_dataplus)._M_p =
                           (pointer)&__return_storage_ptr__->field_2;
                      sVar9 = strlen(pcVar8);
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)__return_storage_ptr__,pcVar8,pcVar8 + sVar9);
                    }
                  }
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_220._M_dataplus._M_p != &local_220.field_2) {
                  operator_delete(local_220._M_dataplus._M_p,
                                  CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                           local_220.field_2._M_local_buf[0]) + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_260._M_dataplus._M_p != &local_260.field_2) {
                  operator_delete(local_260._M_dataplus._M_p,
                                  CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                           local_260.field_2._M_local_buf[0]) + 1);
                }
              }
              else {
                bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                  (this_00,(cmGeneratorTarget *)0x0);
                if (!bVar2) {
                  bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingIncludeDirectories(this_00);
                  if ((((!bVar2) &&
                       (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSystemIncludeDirectories
                                          (this_00), !bVar2)) &&
                      ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileDefinitions
                                          (this_00), !bVar2 &&
                       ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileOptions(this_00),
                        !bVar2 && (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingAutoUicOptions
                                                     (this_00), !bVar2)))))) &&
                     ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(this_00), !bVar2
                      && ((((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingCompileFeatures
                                               (this_00), !bVar2 &&
                            (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkOptions(this_00)
                            , !bVar2)) &&
                           (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDirectories
                                              (this_00), !bVar2)) &&
                          (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkDepends(this_00),
                          !bVar2)))))) {
                    __assert_fail("CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD( ASSERT_TRANSITIVE_PROPERTY_METHOD) false"
                                  ,
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmGeneratorExpressionNode.cxx"
                                  ,0x4ee,
                                  "virtual std::string TargetPropertyNode::Evaluate(const std::vector<std::string> &, cmGeneratorExpressionContext *, const GeneratorExpressionContent *, cmGeneratorExpressionDAGChecker *) const"
                                 );
                  }
                  goto LAB_003874a9;
                }
                iVar3 = std::__cxx11::string::compare((char *)&local_2a8);
                if ((((iVar3 == 0) ||
                     (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)) ||
                    (((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                      ((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                       (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)))) ||
                     (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)))) ||
                   ((((((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                        (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)) ||
                       (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)) ||
                      (((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                        (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)) ||
                       ((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                        ((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                         (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)))))
                       ))) || (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0
                              )) ||
                    ((((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                       (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)) ||
                      (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0)) ||
                     ((iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0 ||
                      (iVar3 = std::__cxx11::string::compare((char *)&local_2a8), iVar3 == 0))))))))
                {
                  GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_260,content);
                  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_220,
                             "$<TARGET_PROPERTY:...> expression in link libraries evaluation depends on target property which is transitive over the link libraries, creating a recursion."
                             ,"");
                  reportError(context,&local_260,&local_220);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_220._M_dataplus._M_p != &local_220.field_2) {
                    operator_delete(local_220._M_dataplus._M_p,
                                    CONCAT71(local_220.field_2._M_allocated_capacity._1_7_,
                                             local_220.field_2._M_local_buf[0]) + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_260._M_dataplus._M_p != &local_260.field_2) {
                    operator_delete(local_260._M_dataplus._M_p,
                                    CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                             local_260.field_2._M_local_buf[0]) + 1);
                  }
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  __return_storage_ptr__->_M_string_length = 0;
                  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                }
                else {
                  if (local_1e0 != (char *)0x0) goto LAB_003874a9;
                  (__return_storage_ptr__->_M_dataplus)._M_p =
                       (pointer)&__return_storage_ptr__->field_2;
                  __return_storage_ptr__->_M_string_length = 0;
                  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_288._M_dataplus._M_p != &local_288.field_2) {
                operator_delete(local_288._M_dataplus._M_p,
                                CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                         local_288.field_2._M_local_buf[0]) + 1);
              }
            }
LAB_00388056:
            if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
            }
            std::
            _Rb_tree<const_cmGeneratorTarget_*,_std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<const_cmGeneratorTarget_*>,_std::allocator<std::pair<const_cmGeneratorTarget_*const,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&local_178);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._16_8_ != &local_188) {
              operator_delete((void *)local_1a8._16_8_,local_188._M_allocated_capacity + 1);
            }
            goto LAB_00387123;
          }
          TVar6 = cmGeneratorTarget::GetType(local_2b0);
          if (((local_268 == (cmGeneratorExpressionDAGChecker *)0x0) || (TVar6 != STATIC_LIBRARY))
             || ((bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingLinkLibraries
                                    (local_268,(cmGeneratorTarget *)0x0), !bVar2 &&
                 (bVar2 = cmGeneratorExpressionDAGChecker::EvaluatingSources(local_268), !bVar2))))
          {
            cmGeneratorTarget::GetLinkerLanguage(__return_storage_ptr__,local_2b0,&context->Config);
            goto LAB_00387123;
          }
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_288,
                     "LINKER_LANGUAGE target property can not be used while evaluating link libraries for a static library"
                     ,"");
          reportError(context,(string *)local_1a8,&local_288);
        }
        else {
          GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
          local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_288,"Property name not supported.","");
          reportError(context,(string *)local_1a8,&local_288);
        }
      }
    }
LAB_003870d3:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,
                      CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                               local_288.field_2._M_local_buf[0]) + 1);
    }
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
  }
  else {
    if (lVar7 != 2) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_288,
                 "$<TARGET_PROPERTY:...> expression requires one or two parameters","");
      reportError(context,(string *)local_1a8,&local_288);
      goto LAB_003870d3;
    }
    std::__cxx11::string::_M_assign((string *)&local_240);
    std::__cxx11::string::_M_assign((string *)&local_2a8);
    pcVar8 = GetErrorText(&local_240,&local_2a8);
    if (pcVar8 != (char *)0x0) {
      GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_((string *)local_1a8,content);
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      sVar9 = strlen(pcVar8);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,pcVar8,pcVar8 + sVar9);
      reportError(context,(string *)local_1a8,&local_288);
      goto LAB_003870d3;
    }
    if ((local_2a8._M_string_length != 0xe) ||
       (*(long *)(local_2a8._M_dataplus._M_p + 6) != 0x5445475241545f44 ||
        *(size_type *)local_2a8._M_dataplus._M_p != 0x5f44455341494c41)) {
      local_2b0 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_240);
      if (local_2b0 == (cmGeneratorTarget *)0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Target \"",8);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_240._M_dataplus._M_p,
                             local_240._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\" not found.",0xc);
        GeneratorExpressionContent::GetOriginalExpression_abi_cxx11_(&local_288,content);
        std::__cxx11::stringbuf::str();
        reportError(context,&local_288,&local_260);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_260._M_dataplus._M_p != &local_260.field_2) {
          operator_delete(local_260._M_dataplus._M_p,
                          CONCAT71(local_260.field_2._M_allocated_capacity._1_7_,
                                   local_260.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_288._M_dataplus._M_p != &local_288.field_2) {
          operator_delete(local_288._M_dataplus._M_p,
                          CONCAT71(local_288.field_2._M_allocated_capacity._1_7_,
                                   local_288.field_2._M_local_buf[0]) + 1);
        }
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        __return_storage_ptr__->_M_string_length = 0;
        (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)&local_138);
        goto LAB_00387123;
      }
      std::
      _Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
      ::_M_insert_unique<cmGeneratorTarget_const*const&>
                ((_Rb_tree<cmGeneratorTarget_const*,cmGeneratorTarget_const*,std::_Identity<cmGeneratorTarget_const*>,std::less<cmGeneratorTarget_const*>,std::allocator<cmGeneratorTarget_const*>>
                  *)&context->AllTargets,&local_2b0);
      goto LAB_00386f9e;
    }
    bVar2 = cmMakefile::IsAlias(context->LG->Makefile,&local_240);
    if ((bVar2) &&
       (pcVar11 = cmLocalGenerator::FindGeneratorTargetToUse(context->LG,&local_240),
       pcVar11 != (cmGeneratorTarget *)0x0)) {
      psVar12 = cmGeneratorTarget::GetName_abi_cxx11_(pcVar11);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar1 = (psVar12->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,pcVar1 + psVar12->_M_string_length);
      goto LAB_00387123;
    }
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
LAB_00387123:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,
                    CONCAT71(local_2a8.field_2._M_allocated_capacity._1_7_,
                             local_2a8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,
                    CONCAT71(local_240.field_2._M_allocated_capacity._1_7_,
                             local_240.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Evaluate(
    const std::vector<std::string>& parameters,
    cmGeneratorExpressionContext* context,
    const GeneratorExpressionContent* content,
    cmGeneratorExpressionDAGChecker* dagCheckerParent) const override
  {
    static cmsys::RegularExpression propertyNameValidator("^[A-Za-z0-9_]+$");

    cmGeneratorTarget const* target = nullptr;
    std::string targetName, propertyName;

    if (parameters.size() == 2) {
      targetName = parameters[0];
      propertyName = parameters[1];

      if (const char* e = GetErrorText(targetName, propertyName)) {
        reportError(context, content->GetOriginalExpression(), e);
        return std::string();
      }
      if (propertyName == "ALIASED_TARGET"_s) {
        if (context->LG->GetMakefile()->IsAlias(targetName)) {
          if (cmGeneratorTarget* tgt =
                context->LG->FindGeneratorTargetToUse(targetName)) {
            return tgt->GetName();
          }
        }
        return std::string();
      }
      target = context->LG->FindGeneratorTargetToUse(targetName);

      if (!target) {
        std::ostringstream e;
        e << "Target \"" << targetName << "\" not found.";
        reportError(context, content->GetOriginalExpression(), e.str());
        return std::string();
      }
      context->AllTargets.insert(target);

    } else if (parameters.size() == 1) {
      target = context->HeadTarget;
      propertyName = parameters[0];

      // Keep track of the properties seen while processing.
      // The evaluation of the LINK_LIBRARIES generator expressions
      // will check this to ensure that properties have one consistent
      // value for all evaluations.
      context->SeenTargetProperties.insert(propertyName);

      context->HadHeadSensitiveCondition = true;
      if (!target) {
        reportError(
          context, content->GetOriginalExpression(),
          "$<TARGET_PROPERTY:prop>  may only be used with binary targets.  "
          "It may not be used with add_custom_command or add_custom_target.  "
          "Specify the target to read a property from using the "
          "$<TARGET_PROPERTY:tgt,prop> signature instead.");
        return std::string();
      }
    } else {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires one or two parameters");
      return std::string();
    }

    if (propertyName == "SOURCES") {
      context->SourceSensitiveTargets.insert(target);
    }

    if (propertyName.empty()) {
      reportError(
        context, content->GetOriginalExpression(),
        "$<TARGET_PROPERTY:...> expression requires a non-empty property "
        "name.");
      return std::string();
    }

    if (!propertyNameValidator.find(propertyName)) {
      ::reportError(context, content->GetOriginalExpression(),
                    "Property name not supported.");
      return std::string();
    }

    assert(target);

    if (propertyName == "LINKER_LANGUAGE") {
      if (target->LinkLanguagePropagatesToDependents() && dagCheckerParent &&
          (dagCheckerParent->EvaluatingLinkLibraries() ||
           dagCheckerParent->EvaluatingSources())) {
        reportError(
          context, content->GetOriginalExpression(),
          "LINKER_LANGUAGE target property can not be used while evaluating "
          "link libraries for a static library");
        return std::string();
      }
      return target->GetLinkerLanguage(context->Config);
    }

    cmGeneratorExpressionDAGChecker dagChecker(
      context->Backtrace, target, propertyName, content, dagCheckerParent);

    switch (dagChecker.Check()) {
      case cmGeneratorExpressionDAGChecker::SELF_REFERENCE:
        dagChecker.ReportError(context, content->GetOriginalExpression());
        return std::string();
      case cmGeneratorExpressionDAGChecker::CYCLIC_REFERENCE:
        // No error. We just skip cyclic references.
        return std::string();
      case cmGeneratorExpressionDAGChecker::ALREADY_SEEN:
        for (size_t i = 1; i < cm::size(targetPropertyTransitiveWhitelist);
             ++i) {
          if (targetPropertyTransitiveWhitelist[i] == propertyName) {
            // No error. We're not going to find anything new here.
            return std::string();
          }
        }
      case cmGeneratorExpressionDAGChecker::DAG:
        break;
    }

    std::string prop;
    bool haveProp = false;
    if (const char* p = target->GetProperty(propertyName)) {
      prop = p;
      haveProp = true;
    }

    if (dagCheckerParent) {
      if (dagCheckerParent->EvaluatingGenexExpression() ||
          dagCheckerParent->EvaluatingPICExpression()) {
        // No check required.
      } else if (dagCheckerParent->EvaluatingLinkLibraries()) {
#define TRANSITIVE_PROPERTY_COMPARE(PROPERTY)                                 \
  (#PROPERTY == propertyName || "INTERFACE_" #PROPERTY == propertyName) ||
        if (CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(
              TRANSITIVE_PROPERTY_COMPARE) false) { // NOLINT(*)
          reportError(
            context, content->GetOriginalExpression(),
            "$<TARGET_PROPERTY:...> expression in link libraries "
            "evaluation depends on target property which is transitive "
            "over the link libraries, creating a recursion.");
          return std::string();
        }
#undef TRANSITIVE_PROPERTY_COMPARE

        if (!haveProp) {
          return std::string();
        }
      } else {
#define ASSERT_TRANSITIVE_PROPERTY_METHOD(METHOD) dagCheckerParent->METHOD() ||

        assert(CM_FOR_EACH_TRANSITIVE_PROPERTY_METHOD(
          ASSERT_TRANSITIVE_PROPERTY_METHOD) false); // NOLINT(clang-tidy)
#undef ASSERT_TRANSITIVE_PROPERTY_METHOD
      }
    }

    std::string linkedTargetsContent;

    std::string interfacePropertyName;
    bool isInterfaceProperty = false;

#define POPULATE_INTERFACE_PROPERTY_NAME(prop)                                \
  if (propertyName == #prop) {                                                \
    interfacePropertyName = "INTERFACE_" #prop;                               \
  } else if (propertyName == "INTERFACE_" #prop) {                            \
    interfacePropertyName = "INTERFACE_" #prop;                               \
    isInterfaceProperty = true;                                               \
  } else

    CM_FOR_EACH_TRANSITIVE_PROPERTY_NAME(POPULATE_INTERFACE_PROPERTY_NAME)
    // Note that the above macro terminates with an else
    /* else */ if (cmHasLiteralPrefix(propertyName, "COMPILE_DEFINITIONS_")) {
      cmPolicies::PolicyStatus polSt =
        context->LG->GetPolicyStatus(cmPolicies::CMP0043);
      if (polSt == cmPolicies::WARN || polSt == cmPolicies::OLD) {
        interfacePropertyName = "INTERFACE_COMPILE_DEFINITIONS";
      }
    }
#undef POPULATE_INTERFACE_PROPERTY_NAME
    cmGeneratorTarget const* headTarget =
      context->HeadTarget && isInterfaceProperty ? context->HeadTarget
                                                 : target;

    if (isInterfaceProperty) {
      if (cmLinkInterfaceLibraries const* iface =
            target->GetLinkInterfaceLibraries(context->Config, headTarget,
                                              true)) {
        linkedTargetsContent =
          getLinkedTargetsContent(iface->Libraries, target, headTarget,
                                  context, &dagChecker, interfacePropertyName);
      }
    } else if (!interfacePropertyName.empty()) {
      if (cmLinkImplementationLibraries const* impl =
            target->GetLinkImplementationLibraries(context->Config)) {
        linkedTargetsContent =
          getLinkedTargetsContent(impl->Libraries, target, target, context,
                                  &dagChecker, interfacePropertyName);
      }
    }

    if (!haveProp) {
      if (target->IsImported() ||
          target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
        return linkedTargetsContent;
      }
      if (target->IsLinkInterfaceDependentBoolProperty(propertyName,
                                                       context->Config)) {
        context->HadContextSensitiveCondition = true;
        return target->GetLinkInterfaceDependentBoolProperty(propertyName,
                                                             context->Config)
          ? "1"
          : "0";
      }
      if (target->IsLinkInterfaceDependentStringProperty(propertyName,
                                                         context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentStringProperty(propertyName,
                                                          context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }

      return linkedTargetsContent;
    }

    if (!target->IsImported() && dagCheckerParent &&
        !dagCheckerParent->EvaluatingLinkLibraries()) {
      if (target->IsLinkInterfaceDependentNumberMinProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMinProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
      if (target->IsLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                            context->Config)) {
        context->HadContextSensitiveCondition = true;
        const char* propContent =
          target->GetLinkInterfaceDependentNumberMaxProperty(propertyName,
                                                             context->Config);
        return propContent ? propContent : "";
      }
    }
    if (!interfacePropertyName.empty()) {
      std::string result = this->EvaluateDependentExpression(
        prop, context->LG, context, headTarget, target, &dagChecker);
      if (!linkedTargetsContent.empty()) {
        result += (result.empty() ? "" : ";") + linkedTargetsContent;
      }
      return result;
    }
    return prop;
  }